

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

Net * __thiscall notch::core::MakeNet::make(Net *__return_storage_ptr__,MakeNet *this)

{
  undefined4 *puVar1;
  LayerType LVar2;
  pointer pMVar3;
  logic_error *this_00;
  long lVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  ulong uVar5;
  value_type lmaker;
  undefined1 local_c8 [56];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  shared_ptr<notch::core::ABackpropLayer> local_88;
  shared_ptr<notch::core::ABackpropLayer> local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined8 local_38;
  
  __return_storage_ptr__->_vptr_Net = (_func_int **)&PTR_append_0011e690;
  (__return_storage_ptr__->layers).
  super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->layers).
  super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->layers).
  super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->lossLayer).
  super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->lossLayer).
  super___shared_ptr<notch::core::ALossLayer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pMVar3 = (this->layerMakers).
           super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->layerMakers).
      super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>._M_impl.
      super__Vector_impl_data._M_finish != pMVar3) {
    lVar4 = 0xc;
    uVar5 = 0;
    do {
      LVar2 = (this->layerTypes).
              super__Vector_base<notch::core::MakeNet::LayerType,_std::allocator<notch::core::MakeNet::LayerType>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar5];
      puVar1 = (undefined4 *)((long)pMVar3 + lVar4 * 4 + -0x30);
      local_68 = *puVar1;
      uStack_64 = puVar1[1];
      uStack_60 = puVar1[2];
      uStack_5c = puVar1[3];
      local_58 = *(undefined8 *)((long)pMVar3 + lVar4 * 4 + -0x20);
      local_50 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)pMVar3 + lVar4 * 4 + -0x18);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_50->_M_use_count = local_50->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_50->_M_use_count = local_50->_M_use_count + 1;
        }
      }
      local_48 = *(undefined8 *)((long)pMVar3 + lVar4 * 4 + -0x10);
      local_40 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)pMVar3 + lVar4 * 4 + -8);
      if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_40->_M_use_count = local_40->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_40->_M_use_count = local_40->_M_use_count + 1;
        }
      }
      local_38 = *(undefined8 *)((long)&pMVar3->nInputs + lVar4 * 4);
      switch(LVar2) {
      case FC:
        MakeLayer::FC((MakeLayer *)local_c8);
        local_78.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)local_c8._0_8_;
        local_78.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
        local_c8._0_8_ = (element_type *)0x0;
        local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Net::append(__return_storage_ptr__,&local_78);
        this_01._M_pi =
             local_78.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        break;
      case Activation:
        MakeLayer::activation((MakeLayer *)local_c8);
        local_88.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)local_c8._0_8_;
        local_88.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
        local_c8._0_8_ = (element_type *)0x0;
        local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Net::append(__return_storage_ptr__,&local_88);
        this_01._M_pi =
             local_88.super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        break;
      case L2Loss:
        MakeLayer::L2Loss((MakeLayer *)local_c8);
        local_c8._48_8_ = local_c8._0_8_;
        p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_;
        local_c8._0_8_ = (element_type *)0x0;
        local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Net::append(__return_storage_ptr__,(shared_ptr<notch::core::ALossLayer> *)(local_c8 + 0x30))
        ;
        this_01._M_pi = p_Stack_90;
        break;
      case Softmax:
        MakeLayer::softmax((MakeLayer *)local_c8);
        local_c8._32_8_ = local_c8._0_8_;
        local_c8._40_8_ = local_c8._8_8_;
        local_c8._0_8_ = (element_type *)0x0;
        local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Net::append(__return_storage_ptr__,(shared_ptr<notch::core::ALossLayer> *)(local_c8 + 0x20))
        ;
        this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._40_8_;
        break;
      case Hinge:
        MakeLayer::hinge((MakeLayer *)local_c8);
        local_c8._16_8_ = local_c8._0_8_;
        local_c8._24_8_ = local_c8._8_8_;
        local_c8._0_8_ = (element_type *)0x0;
        local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Net::append(__return_storage_ptr__,(shared_ptr<notch::core::ALossLayer> *)(local_c8 + 0x10))
        ;
        this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._24_8_;
        break;
      default:
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        ::std::logic_error::logic_error(this_00,"unsupported layer type");
        __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
      }
      if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
      }
      if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
      }
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
      uVar5 = uVar5 + 1;
      pMVar3 = (this->layerMakers).
               super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar4 = lVar4 + 0xe;
    } while (uVar5 < (ulong)(((long)(this->layerMakers).
                                    super__Vector_base<notch::core::MakeLayer,_std::allocator<notch::core::MakeLayer>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar3 >> 3)
                            * 0x6db6db6db6db6db7));
  }
  return __return_storage_ptr__;
}

Assistant:

Net make() {
        Net net;
        for (size_t i = 0; i < layerMakers.size(); ++i) {
            auto ltype = layerTypes[i];
            auto lmaker = layerMakers[i];
            switch (ltype) {
                case LayerType::FC:
                    net.append(lmaker.FC()); break;
                case LayerType::Activation:
                    net.append(lmaker.activation()); break;
                case LayerType::L2Loss:
                    net.append(lmaker.L2Loss()); break;
                case LayerType::Softmax:
                    net.append(lmaker.softmax()); break;
                case LayerType::Hinge:
                    net.append(lmaker.hinge()); break;
                default:
                    throw std::logic_error("unsupported layer type"); break;
            }
        }
        return net;
    }